

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O1

void ppu_tick(nes_system *system)

{
  uint16_t *puVar1;
  undefined1 *puVar2;
  nes_ppu_status_reg *pnVar3;
  uint8_t *puVar4;
  uint8_t uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  _func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *p_Var13;
  nes_cartridge *pnVar14;
  _func_void_nes_video_output_ptr_void_ptr *p_Var15;
  uint8_t uVar16;
  uint16_t uVar17;
  nes_ppu_render_mask nVar18;
  byte bVar19;
  uint32_t i;
  uint uVar20;
  nes_system_state *state;
  int iVar21;
  ushort uVar22;
  uint32_t i_1;
  short sVar25;
  anon_union_2_2_2ecd3576_for_nes_ppu_12 aVar26;
  uint uVar23;
  int iVar24;
  ushort uVar27;
  byte bVar28;
  ushort uVar29;
  nes_ppu_render_mask nVar30;
  uint uVar31;
  uint uVar32;
  int i_2;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  nes_video_output local_40;
  
  uVar5 = (system->state).ppu.reg_rw_mode;
  bVar28 = (system->state).ppu.field_0xa;
  if (((bVar28 >> 4 | bVar28 >> 3) & 1) != 0) {
    uVar22 = (system->state).ppu.vram_address;
    uVar33 = uVar22 & 0x3fff;
    uVar35 = (ulong)uVar33;
    uVar23 = (uint)uVar22;
    if ((bVar28 & 8) == 0) {
      p_Var13 = (system->config).memory_callback;
      if (p_Var13 != (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0)
      {
        (*p_Var13)(NES_MEMORY_TYPE_PPU,NES_MEMORY_OP_WRITE,uVar22,&(system->state).ppu.vram_data,
                   (system->config).client_data);
      }
      if (uVar33 < 0x2000) {
        if (system->cartridge->chr_rom_size <= uVar35) {
          (system->state).chr_ram[uVar35] = (system->state).ppu.vram_data;
        }
      }
      else {
        uVar31 = uVar23 & 0xfff;
        if ((~uVar23 & 0x3f00) != 0) {
          uVar31 = uVar33 - 0x2000;
        }
        uVar35 = (ulong)uVar31;
        if ((uVar31 & 0xffff) < 0x1000) {
          uVar17 = (*system->cartridge->mapper->get_nametable_address)
                             (system->cartridge,(uint16_t)uVar31);
          uVar35 = (ulong)uVar17;
        }
        (system->state).vram[uVar35 & 0xffff] = (system->state).ppu.vram_data;
      }
    }
    else {
      pnVar14 = system->cartridge;
      if (uVar33 < 0x2000) {
        if (uVar35 < pnVar14->chr_rom_size) {
          uVar16 = (*pnVar14->mapper->read_chr)(pnVar14,(uint16_t)uVar33);
        }
        else {
          uVar16 = (system->state).chr_ram[uVar35];
        }
      }
      else {
        uVar23 = uVar23 & 0xfff;
        if ((~uVar22 & 0x3f00) != 0) {
          uVar23 = uVar33 - 0x2000;
        }
        uVar35 = (ulong)uVar23;
        if ((uVar23 & 0xffff) < 0x1000) {
          uVar17 = (*pnVar14->mapper->get_nametable_address)(pnVar14,(uint16_t)uVar23);
          uVar35 = (ulong)uVar17;
        }
        uVar16 = (system->state).vram[uVar35 & 0xffff];
      }
      (system->state).ppu.vram_data = uVar16;
      p_Var13 = (system->config).memory_callback;
      if (p_Var13 != (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0)
      {
        (*p_Var13)(NES_MEMORY_TYPE_PPU,NES_MEMORY_OP_READ,(system->state).ppu.vram_address,
                   &(system->state).ppu.vram_data,(system->config).client_data);
      }
    }
  }
  nVar18 = (system->state).ppu.next_render_mask;
  uVar33 = (system->state).ppu.dot + 1;
  (system->state).ppu.dot = uVar33;
  if (0x154 < uVar33) {
    uVar11 = (system->state).ppu.scanline;
    (system->state).ppu.scanline = uVar11 + ((uVar11 + 1) / 0x106) * -0x106 + 1;
    (system->state).ppu.dot = 0;
  }
  bVar28 = (system->state).ppu.status.b;
  if ((char)bVar28 < '\0') {
    bVar19 = (system->state).ppu.ctrl.b >> 2 & 0x20;
  }
  else {
    bVar19 = 0;
  }
  bVar6 = (system->state).ppu.field_0xa;
  (system->state).ppu.field_0xa = bVar6 & 0xdf | bVar19;
  uVar33 = (system->state).ppu.scanline;
  if (uVar33 == 0x105) {
    if ((system->state).ppu.dot == 1) {
      (system->state).ppu.status.b = bVar28 & 0x1f;
      (system->state).ppu.is_even_frame = (uint)((system->state).ppu.is_even_frame == 0);
      lVar34 = 0;
      bVar28 = 0;
      do {
        bVar7 = (system->state).ppu.open_bus_decay_timer[lVar34];
        (system->state).ppu.open_bus_decay_timer[lVar34] = bVar7 + 1;
        bVar28 = bVar28 | (bVar7 < 0x24) << ((byte)lVar34 & 0x1f);
        lVar34 = lVar34 + 1;
      } while (lVar34 != 8);
      puVar4 = &(system->state).ppu.open_bus;
      *puVar4 = *puVar4 & bVar28;
    }
  }
  else if (uVar33 == 0xf1) {
    uVar11 = (system->state).ppu.dot;
    if (uVar11 == 1) {
      (system->state).ppu.status.b = bVar28 & 0x7f | (system->state).ppu.pre_vblank << 7;
    }
    else if (uVar11 == 0) {
      (system->state).ppu.pre_vblank = '\x01';
    }
  }
  if (((bVar6 >> 4 | bVar6 >> 3) & 1) != 0) {
    if ((0xef < uVar33 && uVar33 != 0x105) ||
       (((system->state).ppu.render_mask & NES_PPU_RENDER_MASK_RENDER) == 0)) {
      sVar25 = 0x20;
      if (((system->state).ppu.ctrl.b & 4) == 0) {
        sVar25 = 1;
      }
      puVar1 = &(system->state).ppu.vram_address;
      *puVar1 = *puVar1 + sVar25;
    }
    if ((system->state).ppu.update_cpu_read_buffer != 0) {
      (system->state).ppu.cpu_read_buffer = (system->state).ppu.vram_data;
      (system->state).ppu.update_cpu_read_buffer = 0;
    }
    (system->state).ppu.field_0xa = bVar6 & 199 | bVar19;
  }
  uVar16 = (system->state).ppu.reg_rw_mode;
  if (uVar16 != '\0') {
    bVar28 = 0xff;
    if (uVar16 == '\x01') {
      (system->state).ppu.reg_data = (system->state).ppu.open_bus;
      bVar28 = 0;
    }
    bVar19 = (system->state).ppu.field_0xa;
    switch(bVar19 & 7) {
    case 0:
      if (uVar16 == '\x02') {
        bVar19 = (system->state).ppu.reg_data;
        (system->state).ppu.ctrl.b = bVar19;
        (system->state).ppu.field_11.t_addr_reg =
             (system->state).ppu.field_11.t_addr_reg & 0xf3ff | (bVar19 & 3) << 10;
      }
      break;
    case 1:
      if (uVar16 == '\x02') {
        nVar18 = (nes_ppu_render_mask)(system->state).ppu.reg_data;
      }
      break;
    case 2:
      if (uVar16 == '\x01') {
        bVar28 = (system->state).ppu.status.b;
        (system->state).ppu.reg_data = (system->state).ppu.open_bus & 0x1f | bVar28 & 0xe0;
        (system->state).ppu.status.b = bVar28 & 0x7f;
        (system->state).ppu.write_toggle = 0;
        (system->state).ppu.pre_vblank = '\0';
        bVar28 = 0xe0;
      }
      break;
    case 3:
      if (uVar16 == '\x02') {
        (system->state).ppu.oam_address = (system->state).ppu.reg_data;
      }
      break;
    case 4:
      if (uVar16 == '\x02') {
        bVar19 = (system->state).ppu.oam_address;
        bVar6 = (system->state).ppu.reg_data;
        bVar7 = bVar6 & 0xe3;
        if ((bVar19 & 3) != 2) {
          bVar7 = bVar6;
        }
        (system->state).ppu.sprite_shift_high[(ulong)bVar19 + 0x25] = bVar7;
        (system->state).ppu.oam_address = bVar19 + 1;
      }
      else {
        (system->state).ppu.reg_data =
             (system->state).ppu.sprite_shift_high[(ulong)(system->state).ppu.oam_address + 0x25];
        bVar28 = 0xff;
      }
      break;
    case 5:
      if (uVar16 == '\x02') {
        iVar24 = (system->state).ppu.write_toggle;
        bVar19 = (system->state).ppu.reg_data;
        uVar29 = (ushort)(bVar19 >> 3);
        uVar27 = bVar19 & 7;
        uVar22 = (system->state).ppu.field_11.t_addr_reg;
        if (iVar24 == 0) {
          (system->state).ppu.field_11.t_addr_reg = uVar22 & 0xffe0 | uVar29;
          (system->state).ppu.fine_x = (uint8_t)uVar27;
        }
        else {
          (system->state).ppu.field_11.t_addr_reg = uVar27 << 0xc | uVar22 & 0x8c1f | uVar29 << 5;
        }
        (system->state).ppu.write_toggle = (uint)(iVar24 == 0);
      }
      break;
    case 6:
      if (uVar16 == '\x02') {
        iVar24 = (system->state).ppu.write_toggle;
        if (iVar24 == 0) {
          aVar26.t_addr_reg =
               (ushort)(byte)(system->state).ppu.vram_address |
               ((system->state).ppu.reg_data & 0x7f) << 8;
          lVar34 = 0x22;
        }
        else {
          aVar26.t_addr_reg._1_1_ = *(undefined1 *)((long)&(system->state).ppu.field_11 + 1);
          aVar26.t_addr_reg._0_1_ = (system->state).ppu.reg_data;
          (system->state).ppu.field_11 = aVar26;
          (system->state).ppu.field_10 = (anon_union_2_2_812c8e36_for_nes_ppu_10)aVar26;
          lVar34 = 0x6e;
        }
        *(anon_union_2_2_2ecd3576_for_nes_ppu_12 *)
         ((system->state).ppu.sprite_attributes + lVar34 + -0x34) = aVar26;
        (system->state).ppu.write_toggle = (uint)(iVar24 == 0);
      }
      break;
    case 7:
      uVar22 = (system->state).ppu.vram_address;
      if ((uVar22 & 0xff00) == 0x3f00) {
        uVar23 = 0x1f;
        if ((uVar22 & 0x13) == 0x10) {
          uVar23 = 0xc;
        }
        if (uVar16 == '\x02') {
          (system->state).ppu.palettes[uVar23 & uVar22] = (system->state).ppu.reg_data;
          if ((0xef < uVar33 && uVar33 != 0x105) ||
             (((system->state).ppu.render_mask & NES_PPU_RENDER_MASK_RENDER) == 0)) {
            uVar17 = uVar22 + 1;
            if (((system->state).ppu.ctrl.b & 4) != 0) {
              uVar17 = uVar22 + 0x20;
            }
            (system->state).ppu.vram_address = uVar17;
          }
        }
        else {
          (system->state).ppu.field_0xa = bVar19 | 8;
          (system->state).ppu.reg_data =
               (system->state).ppu.open_bus & 0xc0 |
               (system->state).ppu.palettes[uVar23 & uVar22] & 0x3f;
          (system->state).ppu.update_cpu_read_buffer = 1;
          bVar28 = 0x3f;
        }
      }
      else if (uVar16 == '\x02') {
        (system->state).ppu.field_0xa = bVar19 | 0x10;
        (system->state).ppu.vram_data = (system->state).ppu.reg_data;
      }
      else {
        (system->state).ppu.field_0xa = bVar19 | 8;
        (system->state).ppu.reg_data = (system->state).ppu.cpu_read_buffer;
        (system->state).ppu.update_cpu_read_buffer = 1;
        bVar28 = 0xff;
      }
      if ((uVar33 < 0xf0 || uVar33 == 0x105) &&
         (((system->state).ppu.render_mask & NES_PPU_RENDER_MASK_RENDER) != 0)) {
        uVar23 = *(uint *)&(system->state).ppu.field_10;
        if ((~uVar23 & 0x1f) == 0) {
          uVar23 = uVar23 & 0xffffffe0 ^ 0x400;
        }
        else {
          uVar23 = uVar23 & 0xffffffe0 | uVar23 + 1 & 0x1f;
        }
        uVar22 = (ushort)uVar23;
        (system->state).ppu.field_10.v_addr_reg = uVar22;
        if ((~uVar23 & 0x7000) == 0) {
          (system->state).ppu.field_10.v_addr_reg = uVar22 & 0x8fff;
          uVar23 = uVar23 >> 5 & 0x1f;
          if ((short)uVar23 == 0x1f) {
            uVar22 = uVar22 & 0x8c1f;
          }
          else {
            if (uVar23 != 0x1d) {
              uVar27 = uVar22 + 0x20 & 0x3e0;
              uVar22 = uVar22 & 0x8c1f;
              goto LAB_00105322;
            }
            uVar22 = uVar22 & 0x8c1f ^ 0x800;
          }
        }
        else {
          uVar27 = uVar22 + 0x1000 & 0x7000;
          uVar22 = uVar22 & 0x8fff;
LAB_00105322:
          uVar22 = uVar22 | uVar27;
        }
        (system->state).ppu.field_10.v_addr_reg = uVar22;
      }
    }
    if (bVar28 != 0) {
      (system->state).ppu.open_bus = (system->state).ppu.reg_data;
      lVar34 = 0;
      do {
        if ((bVar28 >> ((uint)lVar34 & 0x1f) & 1) != 0) {
          (system->state).ppu.open_bus_decay_timer[lVar34] = '\0';
        }
        lVar34 = lVar34 + 1;
      } while (lVar34 != 8);
    }
    (system->state).ppu.reg_rw_mode = '\0';
  }
  nVar30 = (system->state).ppu.render_mask & NES_PPU_RENDER_MASK_RENDER;
  if (((nVar18 & NES_PPU_RENDER_MASK_RENDER) == 0) == (nVar30 != 0)) {
    nVar30 = nVar30 | nVar18 & ~NES_PPU_RENDER_MASK_RENDER;
  }
  else {
    (system->state).ppu.next_render_mask = nVar18;
    nVar30 = nVar18;
  }
  (system->state).ppu.render_mask = nVar30;
  if ((0xef < uVar33 && uVar33 != 0x105) || ((nVar30 & NES_PPU_RENDER_MASK_RENDER) == 0))
  goto LAB_001059b1;
  bVar28 = (system->state).ppu.ctrl.b;
  iVar24 = 8 << (bVar28 >> 5 & 1);
  uVar23 = (system->state).ppu.dot;
  if (uVar23 < 0x102) {
    uVar31 = 0;
    if (((nVar30 & NES_PPU_RENDER_MASK_BACKGROUND) == 0) ||
       ((nVar30 & NES_PPU_RENDER_MASK_LEFTMOST_BACKGROUND) == 0 && (int)uVar23 < 10)) {
      uVar32 = 0;
    }
    else {
      uVar16 = (system->state).ppu.fine_x;
      uVar32 = (system->state).ppu.bg_shift_high >> (0xe - uVar16 & 0x1f) & 2 |
               (uint)(((system->state).ppu.bg_shift_low >> ((byte)(0xf - uVar16) & 0x1f) & 1) != 0);
      uVar31 = 0;
      if (uVar32 != 0) {
        uVar31 = (system->state).ppu.attr_shift_high >> (0xc - uVar16 & 0x1f) & 8 |
                 (system->state).ppu.attr_shift_low >> (0xd - uVar16 & 0x1f) & 4 | uVar32;
        uVar32 = 1;
      }
    }
    if (((nVar30 & NES_PPU_RENDER_MASK_SPRITES) != 0) &&
       ((nVar30 & NES_PPU_RENDER_MASK_LEFTMOST_SPRITES) != 0 || 9 < (int)uVar23)) {
      iVar21 = uVar23 - 2;
      lVar34 = 0;
      do {
        bVar19 = (system->state).ppu.sprite_x_positions[lVar34];
        if (iVar21 < (int)(bVar19 + 8) && (int)(uint)bVar19 <= iVar21) {
          bVar19 = (bVar19 - (char)uVar23) + 1;
          uVar20 = (uint)(((system->state).ppu.sprite_shift_low[lVar34] >> (bVar19 & 7) & 1) != 0) |
                   (uint)((system->state).ppu.sprite_shift_high[lVar34] >> (bVar19 & 7)) * 2 & 2;
          if (uVar20 != 0) {
            if (((lVar34 == 0) && ((system->state).ppu.sprite_0_test != '\0')) &&
               (bVar19 = (system->state).ppu.status.b, (bVar19 & 0x40) == 0)) {
              (system->state).ppu.status.b = bVar19 | (iVar21 != 0xff && uVar32 != 0) << 6;
            }
            if ((uVar32 == 0) || (((system->state).ppu.sprite_attributes[lVar34].b & 0x20) == 0)) {
              uVar31 = ((system->state).ppu.sprite_attributes[lVar34].b & 3) << 2 | uVar20 | 0x10;
            }
          }
          if (uVar20 != 0) break;
        }
        lVar34 = lVar34 + 1;
      } while (lVar34 != 8);
    }
    bVar19 = (system->state).ppu.palettes[uVar31];
    (system->state).ppu.color_out = bVar19;
    if ((nVar30 & NES_PPU_RENDER_MASK_GRAYSCALE) != 0) {
      (system->state).ppu.color_out = bVar19 & 0x30;
    }
  }
  else {
    (system->state).ppu.color_out = '\x0f';
  }
  if (uVar23 - 2 < 0x100 || uVar23 - 0x142 < 0x10) {
    puVar1 = &(system->state).ppu.bg_shift_high;
    *puVar1 = *puVar1 << 1;
    puVar1 = &(system->state).ppu.bg_shift_low;
    *puVar1 = *puVar1 << 1;
    puVar1 = &(system->state).ppu.attr_shift_high;
    *puVar1 = *puVar1 << 1;
    puVar1 = &(system->state).ppu.attr_shift_low;
    *puVar1 = *puVar1 << 1;
  }
  if (uVar23 == 0) {
LAB_001055fd:
    if (uVar23 - 1 < 0x140 && (nVar30 & NES_PPU_RENDER_MASK_SPRITES) != 0) {
      uVar31 = uVar23 - 0x101 >> 3;
      uVar35 = (ulong)uVar31;
      bVar19 = (system->state).ppu.eval_oam_byte_count;
      bVar6 = (system->state).ppu.palettes[uVar35 * 4 + -0x20];
      bVar7 = (system->state).ppu.palettes[uVar35 * 4 + -0x1f];
      bVar8 = (system->state).ppu.palettes[uVar35 * 4 + -0x1e];
      uVar16 = (system->state).ppu.palettes[uVar35 * 4 + -0x1d];
      (system->state).ppu.oam_address = '\0';
      (system->state).ppu.sprite_0_test = (system->state).ppu.eval_oam_has_sprite_zero;
      sVar25 = (short)iVar24;
      switch(uVar23 & 7) {
      case 0:
        bVar28 = (system->state).ppu.vram_data;
        if ((bVar8 & 0x40) != 0) {
          bVar28 = (byte)(((ulong)bVar28 * 0x80200802 & 0x884422110) * 0x101010101 >> 0x20);
        }
        (system->state).ppu.sprite_shift_high[uVar35] = bVar28;
        if (bVar19 >> 2 <= uVar31) {
          (system->state).ppu.sprite_shift_high[uVar35] = '\0';
          (system->state).ppu.sprite_shift_low[uVar35] = '\0';
        }
        break;
      case 1:
        (system->state).ppu.sprite_attributes[uVar35].b = bVar8;
        break;
      case 2:
        (system->state).ppu.sprite_x_positions[uVar35] = uVar16;
        break;
      case 5:
        uVar22 = (ushort)bVar7 << 4 & 0xffe0;
        if ((bVar28 & 0x20) == 0) {
          uVar22 = (ushort)bVar7 << 4;
          bVar7 = bVar28 >> 3;
        }
        uVar29 = (short)uVar33 - (ushort)bVar6;
        uVar27 = sVar25 + ~uVar29;
        if (-1 < (char)bVar8) {
          uVar27 = uVar29;
        }
        puVar2 = &(system->state).ppu.field_0xa;
        *puVar2 = *puVar2 | 8;
        (system->state).ppu.vram_address =
             (ushort)(bVar7 & 1) << 0xc | uVar22 | (uVar27 & 8) + uVar27;
        break;
      case 6:
        bVar28 = (system->state).ppu.vram_data;
        if ((bVar8 & 0x40) == 0) {
          (system->state).ppu.sprite_shift_low[uVar35] = bVar28;
        }
        else {
          (system->state).ppu.sprite_shift_low[uVar35] =
               (uint8_t)(((ulong)bVar28 * 0x80200802 & 0x884422110) * 0x101010101 >> 0x20);
        }
        break;
      case 7:
        uVar27 = (ushort)bVar7;
        uVar22 = uVar27 << 4 & 0xffe0;
        if ((bVar28 & 0x20) == 0) {
          bVar7 = bVar28 >> 3;
          uVar22 = uVar27 << 4;
        }
        uVar29 = (short)uVar33 - (ushort)bVar6;
        uVar27 = sVar25 + ~uVar29;
        if (-1 < (char)bVar8) {
          uVar27 = uVar29;
        }
        puVar2 = &(system->state).ppu.field_0xa;
        *puVar2 = *puVar2 | 8;
        (system->state).ppu.vram_address =
             (uVar27 & 8) + uVar27 + 8 | (ushort)(bVar7 & 1) << 0xc | uVar22;
      }
    }
    if (uVar33 == 0x105) {
      if (uVar23 - 0x118 < 0x19) {
        uVar10 = (system->state).ppu.field_10;
        (system->state).ppu.field_10.v_addr_reg =
             (system->state).ppu.field_11.t_addr_reg & 0x7be0 | uVar10 & 0x841f;
      }
      else if ((uVar23 == 0x153) && ((system->state).ppu.is_even_frame == 0)) {
        (system->state).ppu.dot = 0x154;
      }
    }
    goto LAB_001059b1;
  }
  if (0x100 < uVar23 && 0xf < uVar23 - 0x141) {
    if (uVar23 == 0x101) {
      uVar9 = (system->state).ppu.field_10;
      (system->state).ppu.field_10.v_addr_reg =
           (system->state).ppu.field_11.t_addr_reg & 0x41f | uVar9 & 0xfbe0;
    }
    goto LAB_001055fd;
  }
  switch(uVar23 & 7) {
  case 0:
    uVar33 = *(uint *)&(system->state).ppu.field_10;
    if ((~uVar33 & 0x1f) == 0) {
      uVar33 = uVar33 & 0xffffffe0 ^ 0x400;
    }
    else {
      uVar33 = uVar33 & 0xffffffe0 | uVar33 + 1 & 0x1f;
    }
    uVar22 = (ushort)uVar33;
    (system->state).ppu.field_10.v_addr_reg = uVar22;
    if (uVar23 == 1) goto LAB_001058b5;
    if (uVar23 == 0x100) {
      if ((~uVar33 & 0x7000) == 0) {
        (system->state).ppu.field_10.v_addr_reg = uVar22 & 0x8fff;
        uVar33 = uVar33 >> 5 & 0x1f;
        if ((short)uVar33 == 0x1f) {
          uVar22 = uVar22 & 0x8c1f;
        }
        else {
          if (uVar33 != 0x1d) {
            uVar27 = uVar22 + 0x20 & 0x3e0;
            uVar22 = uVar22 & 0x8c1f;
            goto LAB_00105b93;
          }
          uVar22 = uVar22 & 0x8c1f ^ 0x800;
        }
      }
      else {
        uVar27 = uVar22 + 0x1000 & 0x7000;
        uVar22 = uVar22 & 0x8fff;
LAB_00105b93:
        uVar22 = uVar22 | uVar27;
      }
      (system->state).ppu.field_10.v_addr_reg = uVar22;
      goto LAB_001058b0;
    }
    goto LAB_001058bf;
  case 1:
    puVar1 = &(system->state).ppu.bg_shift_high;
    *puVar1 = *puVar1 | (ushort)(system->state).ppu.vram_data;
    puVar1 = &(system->state).ppu.bg_shift_low;
    *puVar1 = *puVar1 | (ushort)(system->state).ppu.bitplane_slice_low;
    bVar28 = (system->state).ppu.palette_attribute;
    puVar1 = &(system->state).ppu.attr_shift_low;
    *puVar1 = *puVar1 | (ushort)(byte)-(bVar28 & 1);
    puVar1 = &(system->state).ppu.attr_shift_high;
    *puVar1 = *puVar1 | (ushort)(byte)((char)(bVar28 << 6) >> 7);
    puVar2 = &(system->state).ppu.field_0xa;
    *puVar2 = *puVar2 | 8;
    uVar22 = (system->state).ppu.field_10.v_addr_reg & 0xfff | 0x2000;
    break;
  case 2:
    (system->state).ppu.tile_value = (system->state).ppu.vram_data;
    goto LAB_001058b0;
  case 3:
    puVar2 = &(system->state).ppu.field_0xa;
    *puVar2 = *puVar2 | 8;
    uVar22 = (system->state).ppu.field_10.v_addr_reg;
    uVar22 = (uVar22 >> 2 & 7) + (uVar22 >> 4 & 0x38 | uVar22 & 0xc00) + 0x23c0;
    break;
  case 4:
    bVar28 = (system->state).ppu.vram_data;
    (system->state).ppu.palette_attribute = bVar28;
    uVar22 = (system->state).ppu.field_10.v_addr_reg;
    if ((uVar22 & 0x40) != 0) {
      (system->state).ppu.palette_attribute = bVar28 >> 4;
    }
    if ((uVar22 & 2) != 0) {
      puVar4 = &(system->state).ppu.palette_attribute;
      *puVar4 = *puVar4 >> 2;
    }
    goto LAB_001058b0;
  case 5:
    puVar2 = &(system->state).ppu.field_0xa;
    *puVar2 = *puVar2 | 8;
    uVar22 = (system->state).ppu.field_10.v_addr_reg >> 0xc & 7 |
             (ushort)(system->state).ppu.tile_value << 4 | (bVar28 & 0x10) << 8;
    break;
  case 6:
    (system->state).ppu.bitplane_slice_low = (system->state).ppu.vram_data;
    goto LAB_001058b0;
  case 7:
    puVar2 = &(system->state).ppu.field_0xa;
    *puVar2 = *puVar2 | 8;
    uVar22 = (system->state).ppu.field_10.v_addr_reg >> 0xc |
             (ushort)(system->state).ppu.tile_value << 4 | (ushort)(bVar28 >> 4 & 1) << 0xc | 8;
  }
  (system->state).ppu.vram_address = uVar22;
LAB_001058b0:
  if (uVar23 == 1) {
LAB_001058b5:
    (system->state).ppu.eval_oam_has_sprite_zero = '\0';
    (system->state).ppu.eval_oam_byte_count = '\0';
    (system->state).ppu.eval_oam_src_addr = '\0';
  }
LAB_001058bf:
  if (0x100 < uVar23) goto LAB_001059b1;
  if (uVar23 < 0x41) {
    (system->state).ppu.palettes[(ulong)(uVar23 - 1 >> 1) - 0x20] = 0xff;
    goto LAB_001059b1;
  }
  if ((uVar23 & 1) != 0) {
    (system->state).ppu.eval_oam_entry_data =
         (system->state).ppu.sprite_shift_high[(ulong)(system->state).ppu.oam_address + 0x25];
    goto LAB_001059b1;
  }
  bVar28 = (system->state).ppu.oam_address;
  if (bVar28 < (system->state).ppu.eval_oam_src_addr) goto LAB_001059b1;
  (system->state).ppu.eval_oam_src_addr = bVar28;
  bVar19 = (system->state).ppu.eval_oam_byte_count;
  if ((bVar19 & 3) == 0) {
    bVar6 = (system->state).ppu.eval_oam_entry_data;
    if (((bVar6 < 0xf0) && (uVar33 = (system->state).ppu.scanline, bVar6 <= uVar33)) &&
       (uVar33 < iVar24 + (uint)bVar6)) {
      if (uVar23 == 0x42) {
        (system->state).ppu.eval_oam_has_sprite_zero = '\x01';
      }
      if (bVar19 == 0x20) {
        pnVar3 = &(system->state).ppu.status;
        pnVar3->b = pnVar3->b | 0x20;
      }
      goto LAB_00105903;
    }
    (system->state).ppu.oam_address = bVar28 + 4;
    if (bVar19 != 0x20) goto LAB_001059b1;
    bVar28 = bVar28 + 1 & 3 | bVar28 + 4 & 0xfc;
  }
  else {
LAB_00105903:
    if (bVar19 < 0x20) {
      uVar16 = (system->state).ppu.eval_oam_entry_data;
      (system->state).ppu.eval_oam_byte_count = bVar19 + 1;
      (system->state).ppu.palettes[(ulong)bVar19 - 0x20] = uVar16;
    }
    bVar28 = bVar28 + 1;
  }
  (system->state).ppu.oam_address = bVar28;
LAB_001059b1:
  (system->state).ppu.render_mask = (system->state).ppu.next_render_mask;
  (system->state).ppu.next_render_mask = nVar18;
  if (((uVar5 == '\x01') && ((system->state).cpu.rw_mode == '\x01')) &&
     (uVar22 = (system->state).cpu.address, (uVar22 & 0xe000) == 0x2000)) {
    uVar5 = (system->state).ppu.reg_data;
    (system->state).cpu.data = uVar5;
    (system->state).cached_ppu_reg[uVar22 & 7] = uVar5;
    p_Var13 = (system->config).memory_callback;
    if ((p_Var13 != (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0)
       && ((*p_Var13)(NES_MEMORY_TYPE_CPU,NES_MEMORY_OP_READ,uVar22,&(system->state).cpu.data,
                      (system->config).client_data), (char)(uVar22 & 7) == '\x04')) {
      (*(system->config).memory_callback)
                (NES_MEMORY_TYPE_OAM,NES_MEMORY_OP_READ,(ushort)(system->state).ppu.oam_address,
                 &(system->state).ppu.reg_data,(system->config).client_data);
    }
  }
  uVar11 = (system->state).ppu.dot;
  uVar12 = (system->state).ppu.scanline;
  system->framebuffer[uVar12 * 0x155 + uVar11] = (system->state).ppu.color_out;
  if (((uVar11 == 0) && (uVar12 == 0xf1)) &&
     (p_Var15 = (system->config).video_callback,
     p_Var15 != (_func_void_nes_video_output_ptr_void_ptr *)0x0)) {
    local_40.framebuffer = (nes_pixel *)(system->framebuffer + 0xaaa);
    local_40.width = 0x100;
    local_40.height = 0xe0;
    local_40._12_1_ = local_40._12_1_ & 0xf0 | (system->state).ppu.is_even_frame == 0;
    (*p_Var15)(&local_40,(system->config).client_data);
  }
  return;
}

Assistant:

static void ppu_tick(nes_system* system)
{
    nes_system_state* state = &system->state;

    int is_reg_read = (state->ppu.reg_rw_mode == NES_PPU_REG_RW_MODE_READ);

    if (state->ppu.r | state->ppu.w)
        ppu_mem_rw(system);

    nes_ppu_execute(&state->ppu);

    if (is_reg_read)
        ppu_cpu_bus(system);
    
    system->framebuffer[state->ppu.scanline * SCANLINE_WIDTH + state->ppu.dot] = state->ppu.color_out;
   
    if (system->config.video_callback && state->ppu.scanline == (RENDER_END_SCANLINE + 1) && state->ppu.dot == 0)
    {
        nes_video_output video_output;
        video_output.framebuffer = (nes_pixel*)(system->framebuffer + 2 + (NES_FRAMEBUFFER_ROW_STRIDE * 8));
        video_output.width  = 256;
        video_output.height = 224;
        video_output.odd_frame = !state->ppu.is_even_frame;
        video_output.emphasize_red      = state->ppu.render_mask & NES_PPU_RENDER_MASK_EMPHASIZE_RED;
        video_output.emphasize_green    = state->ppu.render_mask & NES_PPU_RENDER_MASK_EMPHASIZE_GREEN;
        video_output.emphasize_blue     = state->ppu.render_mask & NES_PPU_RENDER_MASK_EMPHASIZE_BLUE;

        system->config.video_callback(&video_output, system->config.client_data);
    }
}